

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStorage.cpp
# Opt level: O2

int __thiscall OpenMD::DataStorage::copy(DataStorage *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  uint uVar1;
  int extraout_EAX;
  size_t in_RCX;
  int source;
  
  uVar1 = this->storageLayout_;
  source = (int)dst;
  if ((uVar1 & 1) != 0) {
    internalCopy<OpenMD::Vector3<double>>(this,&this->position,source,(size_t)src,in_RCX);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 & 2) != 0) {
    internalCopy<OpenMD::Vector3<double>>(this,&this->velocity,source,(size_t)src,in_RCX);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 & 4) != 0) {
    internalCopy<OpenMD::Vector3<double>>(this,&this->force,source,(size_t)src,in_RCX);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 & 8) != 0) {
    internalCopy<OpenMD::SquareMatrix3<double>>(this,&this->aMat,source,(size_t)src,in_RCX);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 & 0x10) != 0) {
    internalCopy<OpenMD::Vector3<double>>(this,&this->angularMomentum,source,(size_t)src,in_RCX);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 & 0x20) != 0) {
    internalCopy<OpenMD::Vector3<double>>(this,&this->torque,source,(size_t)src,in_RCX);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 & 0x40) != 0) {
    internalCopy<double>(this,&this->particlePot,source,(size_t)src,in_RCX);
    uVar1 = this->storageLayout_;
  }
  if ((char)uVar1 < '\0') {
    internalCopy<double>(this,&this->density,source,(size_t)src,in_RCX);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 >> 8 & 1) != 0) {
    internalCopy<double>(this,&this->functional,source,(size_t)src,in_RCX);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 >> 9 & 1) != 0) {
    internalCopy<double>(this,&this->functionalDerivative,source,(size_t)src,in_RCX);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 >> 10 & 1) != 0) {
    internalCopy<OpenMD::Vector3<double>>(this,&this->dipole,source,(size_t)src,in_RCX);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 >> 0xb & 1) != 0) {
    internalCopy<OpenMD::SquareMatrix3<double>>(this,&this->quadrupole,source,(size_t)src,in_RCX);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 >> 0xc & 1) != 0) {
    internalCopy<OpenMD::Vector3<double>>(this,&this->electricField,source,(size_t)src,in_RCX);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 >> 0xd & 1) != 0) {
    internalCopy<double>(this,&this->skippedCharge,source,(size_t)src,in_RCX);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 >> 0xe & 1) != 0) {
    internalCopy<double>(this,&this->flucQPos,source,(size_t)src,in_RCX);
    uVar1 = this->storageLayout_;
  }
  if ((short)uVar1 < 0) {
    internalCopy<double>(this,&this->flucQVel,source,(size_t)src,in_RCX);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 >> 0x10 & 1) != 0) {
    internalCopy<double>(this,&this->flucQFrc,source,(size_t)src,in_RCX);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 >> 0x11 & 1) == 0) {
    return uVar1;
  }
  internalCopy<double>(this,&this->sitePotential,source,(size_t)src,in_RCX);
  return extraout_EAX;
}

Assistant:

void DataStorage::copy(int source, std::size_t num, std::size_t target) {
    if (num + target > size_) {
      // error
    }

    if (storageLayout_ & dslPosition) {
      internalCopy(position, source, num, target);
    }

    if (storageLayout_ & dslVelocity) {
      internalCopy(velocity, source, num, target);
    }

    if (storageLayout_ & dslForce) { internalCopy(force, source, num, target); }

    if (storageLayout_ & dslAmat) { internalCopy(aMat, source, num, target); }

    if (storageLayout_ & dslAngularMomentum) {
      internalCopy(angularMomentum, source, num, target);
    }

    if (storageLayout_ & dslTorque) {
      internalCopy(torque, source, num, target);
    }

    if (storageLayout_ & dslParticlePot) {
      internalCopy(particlePot, source, num, target);
    }

    if (storageLayout_ & dslDensity) {
      internalCopy(density, source, num, target);
    }

    if (storageLayout_ & dslFunctional) {
      internalCopy(functional, source, num, target);
    }

    if (storageLayout_ & dslFunctionalDerivative) {
      internalCopy(functionalDerivative, source, num, target);
    }

    if (storageLayout_ & dslDipole) {
      internalCopy(dipole, source, num, target);
    }

    if (storageLayout_ & dslQuadrupole) {
      internalCopy(quadrupole, source, num, target);
    }

    if (storageLayout_ & dslElectricField) {
      internalCopy(electricField, source, num, target);
    }

    if (storageLayout_ & dslSkippedCharge) {
      internalCopy(skippedCharge, source, num, target);
    }

    if (storageLayout_ & dslFlucQPosition) {
      internalCopy(flucQPos, source, num, target);
    }

    if (storageLayout_ & dslFlucQVelocity) {
      internalCopy(flucQVel, source, num, target);
    }
    if (storageLayout_ & dslFlucQForce) {
      internalCopy(flucQFrc, source, num, target);
    }

    if (storageLayout_ & dslSitePotential) {
      internalCopy(sitePotential, source, num, target);
    }
  }